

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue440(void)

{
  roaring_bitmap_t *r;
  unsigned_long unaff_retaddr;
  uint32_t largest_item;
  roaring_bitmap_t *b1;
  uint32_t in_stack_00000038;
  uint32_t in_stack_0000003c;
  roaring_bitmap_t *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  uint32_t val;
  
  r = roaring_bitmap_create();
  roaring_bitmap_add_range_closed(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  roaring_bitmap_add_range_closed(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  val = 0x11000;
  roaring_bitmap_contains_range
            (r,CONCAT44(0x11000,in_stack_fffffffffffffff0),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(val,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  roaring_bitmap_contains(r,val);
  _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(val,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  roaring_bitmap_free((roaring_bitmap_t *)0x10ba10);
  return;
}

Assistant:

DEFINE_TEST(issue440) {
    roaring_bitmap_t *b1 = roaring_bitmap_create();
    roaring_bitmap_add_range_closed(b1, 0x20000, 0x2FFFF);
    roaring_bitmap_add_range_closed(b1, 0, 0xFFFF);
    uint32_t largest_item = 0x11000;
    assert_false(roaring_bitmap_contains_range(b1, 0, largest_item + 1));
    assert_false(roaring_bitmap_contains(b1, largest_item));
    roaring_bitmap_free(b1);
}